

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<CLI::Validator_*const_&,_CLI::Validator_*const_&> * __thiscall
Catch::ExprLhs<CLI::Validator*const&>::operator==
          (BinaryExpr<CLI::Validator_*const_&,_CLI::Validator_*const_&> *__return_storage_ptr__,
          ExprLhs<CLI::Validator*const&> *this,Validator **rhs)

{
  Validator **lhs;
  bool comparisonResult;
  StringRef local_30;
  Validator **local_20;
  Validator **rhs_local;
  ExprLhs<CLI::Validator_*const_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (Validator **)this;
  this_local = (ExprLhs<CLI::Validator_*const_&> *)__return_storage_ptr__;
  comparisonResult = compareEqual<CLI::Validator*,CLI::Validator*>(*(Validator ***)this,rhs);
  lhs = *(Validator ***)this;
  StringRef::StringRef(&local_30,"==");
  BinaryExpr<CLI::Validator_*const_&,_CLI::Validator_*const_&>::BinaryExpr
            (__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }